

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TabBarRemoveTab(ImGuiTabBar *tab_bar,ImGuiID tab_id)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  ImGuiTabBar *pIVar4;
  ImGuiTabBar *pIVar5;
  ImGuiTabBar *__dest;
  ulong uVar6;
  bool bVar7;
  
  if (tab_id != 0) {
    uVar3 = (ulong)(tab_bar->Tabs).Size;
    bVar7 = 0 < (long)uVar3;
    __dest = tab_bar;
    if (0 < (long)uVar3) {
      __dest = (ImGuiTabBar *)(tab_bar->Tabs).Data;
      bVar7 = true;
      if ((__dest->Tabs).Size != tab_id) {
        pIVar5 = __dest;
        uVar2 = 1;
        do {
          uVar6 = uVar2;
          pIVar4 = (ImGuiTabBar *)((long)__dest + uVar3 * 0x24 + -0x24);
          if (uVar3 == uVar6) break;
          pIVar4 = (ImGuiTabBar *)&pIVar5->CurrFrameVisible;
          piVar1 = &pIVar5->CurrFrameVisible;
          pIVar5 = pIVar4;
          uVar2 = uVar6 + 1;
        } while (*piVar1 != tab_id);
        bVar7 = uVar6 < uVar3;
        __dest = pIVar4;
      }
    }
    if (bVar7) goto LAB_00153a06;
  }
  __dest = (ImGuiTabBar *)0x0;
LAB_00153a06:
  if (__dest != (ImGuiTabBar *)0x0) {
    memmove(__dest,&__dest->CurrFrameVisible,
            (~(((ulong)((long)__dest - (long)(tab_bar->Tabs).Data) >> 2) * -0x71c71c71c71c71c7) +
            (long)(tab_bar->Tabs).Size) * 0x24);
    (tab_bar->Tabs).Size = (tab_bar->Tabs).Size + -1;
  }
  if (tab_bar->VisibleTabId == tab_id) {
    tab_bar->VisibleTabId = 0;
  }
  if (tab_bar->SelectedTabId == tab_id) {
    tab_bar->SelectedTabId = 0;
  }
  if (tab_bar->NextSelectedTabId == tab_id) {
    tab_bar->NextSelectedTabId = 0;
  }
  return;
}

Assistant:

void ImGui::TabBarRemoveTab(ImGuiTabBar* tab_bar, ImGuiID tab_id)
{
    if (ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, tab_id))
        tab_bar->Tabs.erase(tab);
    if (tab_bar->VisibleTabId == tab_id)      { tab_bar->VisibleTabId = 0; }
    if (tab_bar->SelectedTabId == tab_id)     { tab_bar->SelectedTabId = 0; }
    if (tab_bar->NextSelectedTabId == tab_id) { tab_bar->NextSelectedTabId = 0; }
}